

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O3

void rec_call_setup(jit_State *J,BCReg func,ptrdiff_t nargs)

{
  uint8_t uVar1;
  TRef *pTVar2;
  int iVar3;
  uint uVar4;
  TRef TVar5;
  TRef TVar6;
  IRRef1 IVar7;
  ptrdiff_t pVar8;
  TValue *pTVar9;
  uint *puVar10;
  ulong uVar11;
  GCobj *o;
  RecordIndex ix;
  TValue local_78 [3];
  TValue local_60 [3];
  uint local_48;
  uint local_38;
  
  pTVar2 = J->base;
  pTVar9 = J->L->base + func;
  if (pTVar2[func] == 0) {
    sload(J,func);
  }
  puVar10 = pTVar2 + func;
  if (0 < nargs) {
    uVar11 = (ulong)(func + 1);
    pVar8 = nargs;
    do {
      uVar11 = uVar11 + 1;
      if (J->base[uVar11] == 0) {
        sload(J,(int32_t)uVar11);
      }
      pVar8 = pVar8 + -1;
    } while (pVar8 != 0);
  }
  uVar4 = *puVar10;
  if ((uVar4 & 0x1f000000) != 0x8000000) {
    local_78[0].u64 = *(uint64_t *)pTVar9;
    local_48 = uVar4;
    iVar3 = lj_record_mm_lookup(J,(RecordIndex *)&local_78[0].gcr,MM_call);
    if ((iVar3 == 0) || ((local_38 & 0x1f000000) != 0x8000000)) {
      lj_trace_err(J,LJ_TRERR_NOMM);
    }
    if (0 < nargs) {
      uVar11 = nargs + 2;
      do {
        puVar10[uVar11] = puVar10[uVar11 - 1];
        uVar11 = uVar11 - 1;
      } while (2 < uVar11);
    }
    nargs = nargs + 1;
    puVar10[2] = *puVar10;
    *puVar10 = local_38;
    pTVar9 = local_60;
    uVar4 = local_38;
  }
  o = (GCobj *)(pTVar9->u64 & 0x7fffffffffff);
  uVar1 = (o->gch).unused1;
  IVar7 = (IRRef1)uVar4;
  if ((uVar1 == 'X') || (uVar1 == '$')) {
    (J->fold).ins.field_0.op1 = IVar7;
    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x45100003;
    TVar5 = lj_opt_fold(J);
    TVar6 = lj_ir_kint(J,(uint)(o->gch).unused1);
    (J->fold).ins.field_0.ot = 0x893;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar5;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar6;
    lj_opt_fold(J);
  }
  else if ((uVar1 == '\0') && (pTVar9 = (o->th).base, 0x5f < *(byte *)((long)pTVar9 + -0x2b))) {
    (J->fold).ins.field_0.op1 = IVar7;
    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x45090002;
    TVar5 = lj_opt_fold(J);
    TVar6 = lj_ir_kptr_(J,IR_KPTR,pTVar9);
    (J->fold).ins.field_0.ot = 0x889;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar5;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar6;
    lj_opt_fold(J);
    lj_ir_kgc(J,(GCobj *)(pTVar9 + -0xd),IRT_PROTO);
  }
  else {
    uVar4 = lj_ir_kgc(J,o,IRT_FUNC);
    (J->fold).ins.field_0.ot = 0x888;
    (J->fold).ins.field_0.op1 = IVar7;
    (J->fold).ins.field_0.op2 = (IRRef1)uVar4;
    lj_opt_fold(J);
  }
  *puVar10 = uVar4;
  puVar10[1] = 0x10000;
  J->maxslot = (BCReg)nargs;
  return;
}

Assistant:

static void rec_call_setup(jit_State *J, BCReg func, ptrdiff_t nargs)
{
  RecordIndex ix;
  TValue *functv = &J->L->base[func];
  TRef kfunc, *fbase = &J->base[func];
  ptrdiff_t i;
  (void)getslot(J, func); /* Ensure func has a reference. */
  for (i = 1; i <= nargs; i++)
    (void)getslot(J, func+LJ_FR2+i);  /* Ensure all args have a reference. */
  if (!tref_isfunc(fbase[0])) {  /* Resolve __call metamethod. */
    ix.tab = fbase[0];
    copyTV(J->L, &ix.tabv, functv);
    if (!lj_record_mm_lookup(J, &ix, MM_call) || !tref_isfunc(ix.mobj))
      lj_trace_err(J, LJ_TRERR_NOMM);
    for (i = ++nargs; i > LJ_FR2; i--)  /* Shift arguments up. */
      fbase[i+LJ_FR2] = fbase[i+LJ_FR2-1];
#if LJ_FR2
    fbase[2] = fbase[0];
#endif
    fbase[0] = ix.mobj;  /* Replace function. */
    functv = &ix.mobjv;
  }
  kfunc = rec_call_specialize(J, funcV(functv), fbase[0]);
#if LJ_FR2
  fbase[0] = kfunc;
  fbase[1] = TREF_FRAME;
#else
  fbase[0] = kfunc | TREF_FRAME;
#endif
  J->maxslot = (BCReg)nargs;
}